

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O3

bool __thiscall kj::Path::isWin32Special(Path *this,StringPtr part)

{
  char cVar1;
  undefined2 uVar2;
  bool bVar3;
  uint3 uVar4;
  char *pcVar5;
  int iVar6;
  char cVar9;
  char cVar11;
  undefined1 auVar10 [16];
  byte bVar12;
  byte bVar15;
  byte bVar16;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  char tmp [4];
  undefined5 uVar7;
  undefined1 auVar8 [12];
  
  pcVar5 = part.content.ptr + -1;
  if (pcVar5 != (char *)0x3) {
    if (pcVar5 < (char *)0x4) {
      return false;
    }
    cVar1 = *(char *)((long)&(this->parts).ptr + 3);
    if (cVar1 != '.') {
      if (pcVar5 == (char *)0x4) {
        bVar3 = true;
        if (8 < (byte)(cVar1 - 0x31U)) {
          return false;
        }
      }
      else {
        bVar3 = true;
        if (*(char *)((long)&(this->parts).ptr + 4) != '.' || 8 < (byte)(cVar1 - 0x31U)) {
          return false;
        }
      }
      goto LAB_001ebd3f;
    }
  }
  bVar3 = false;
LAB_001ebd3f:
  cVar1 = *(char *)((long)&(this->parts).ptr + 2);
  uVar2 = *(undefined2 *)&(this->parts).ptr;
  uVar4 = *(uint3 *)&(this->parts).ptr;
  tmp[3] = '\0';
  tmp[0] = (char)uVar4;
  tmp[1] = (char)(uVar4 >> 8);
  tmp[2] = (char)(uVar4 >> 0x10);
  cVar9 = (char)uVar2;
  bVar12 = cVar9 + 0xbf;
  cVar11 = (char)((ushort)uVar2 >> 8);
  bVar15 = cVar11 + 0xbf;
  bVar16 = cVar1 + 0xbf;
  bVar12 = -((byte)((0x1a < bVar12) * bVar12 | (0x1a >= bVar12) * '\x1a') == bVar12);
  iVar6 = CONCAT13(0xff,CONCAT12(-((byte)((0x1a < bVar16) * bVar16 | (0x1a >= bVar16) * '\x1a') ==
                                  bVar16),CONCAT11(-((byte)((0x1a < bVar15) * bVar15 |
                                                           (0x1a >= bVar15) * '\x1a') == bVar15),
                                                   bVar12)));
  uVar7 = CONCAT14(0xff,iVar6);
  auVar8._0_8_ = CONCAT17(0xff,CONCAT16(0xff,CONCAT15(0xff,uVar7)));
  auVar8[8] = 0xff;
  auVar8[9] = 0xff;
  auVar8[10] = 0xff;
  auVar8[0xb] = 0xff;
  auVar14[0xc] = 0xff;
  auVar14._0_12_ = auVar8;
  auVar14[0xd] = 0xff;
  auVar14[0xe] = 0xff;
  auVar14[0xf] = 0xff;
  if ((~bVar12 & 1) != 0) {
    tmp = (char  [4])(CONCAT31(uVar4 >> 8,cVar9) | 0x20);
  }
  auVar13._0_4_ = iVar6 << 8;
  auVar13._4_4_ = (int)((ulong)auVar8._0_8_ >> 0x20) << 8;
  auVar13._8_4_ = auVar8._8_4_ << 8;
  auVar13._12_4_ = auVar14._12_4_ << 8;
  auVar10._8_4_ = 0xffffffff;
  auVar10._0_8_ = 0xffffffffffffffff;
  auVar10._12_4_ = 0xffffffff;
  if (((auVar13 ^ auVar10) & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
    tmp = (char  [4])(CONCAT22(tmp._2_2_,CONCAT11(cVar11,tmp[0])) | 0x2000);
  }
  auVar14 = pshuflw(auVar13 ^ auVar10,auVar14,0x55);
  if (((auVar14._4_2_ ^ 0xffff) & 1) != 0) {
    tmp = (char  [4])(CONCAT12(cVar1,tmp._0_2_) | 0x200000);
  }
  if ((((ushort)((uint5)uVar7 >> 0x18) ^ 0xffff) & 1) != 0) {
    tmp[3] = ' ';
  }
  if (bVar3) {
    if (tmp == (char  [4])0x6d6f63) {
      return true;
    }
    pcVar5 = "lpt";
  }
  else {
    if (tmp == (char  [4])0x6e6f63) {
      return true;
    }
    if (tmp == (char  [4])0x6e7270) {
      return true;
    }
    if (tmp == (char  [4])0x787561) {
      return true;
    }
    pcVar5 = "nul";
  }
  return tmp == *(char (*) [4])pcVar5;
}

Assistant:

inline constexpr char operator[](size_t index) const { return content[index]; }